

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O2

string * SighashToStr_abi_cxx11_(uchar sighash_type)

{
  const_iterator cVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  allocator<char> local_12;
  key_type_conflict6 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::
          _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&mapSigHashTypes_abi_cxx11_._M_t,&local_11);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",&local_12);
  }
  else {
    std::__cxx11::string::string
              ((string *)in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &cVar1._M_node[1]._M_parent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string SighashToStr(unsigned char sighash_type)
{
    const auto& it = mapSigHashTypes.find(sighash_type);
    if (it == mapSigHashTypes.end()) return "";
    return it->second;
}